

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void deqp::gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
               (TestContext *testCtx,RenderContext *renderCtx,CaseFactories *cases,
               vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *shaderTypes,
               TestCaseGroup *dstGroup)

{
  ulong uVar1;
  CommandLine *this;
  size_type sVar2;
  const_reference ppCVar3;
  TestNode *node;
  int local_14c;
  vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
  local_148;
  vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
  local_120;
  ulong local_108;
  size_t ndx;
  PrecisionTestContext ctx;
  FloatFormat lowp;
  FloatFormat mediump;
  FloatFormat highp;
  int numRandoms;
  int defRandoms;
  int userRandoms;
  TestCaseGroup *dstGroup_local;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *shaderTypes_local;
  CaseFactories *cases_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  
  this = tcu::TestContext::getCommandLine(testCtx);
  local_14c = tcu::CommandLine::getTestIterationCount(this);
  if (local_14c < 1) {
    local_14c = 0x4000;
  }
  tcu::FloatFormat::FloatFormat
            ((FloatFormat *)&mediump.m_maxValue,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
  tcu::FloatFormat::FloatFormat((FloatFormat *)&lowp.m_maxValue,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat((FloatFormat *)&ctx.numRandoms,0,0,7,false,YES,MAYBE,MAYBE);
  PrecisionTestContext::PrecisionTestContext
            ((PrecisionTestContext *)&ndx,testCtx,renderCtx,(FloatFormat *)&mediump.m_maxValue,
             (FloatFormat *)&lowp.m_maxValue,(FloatFormat *)&ctx.numRandoms,shaderTypes,local_14c);
  local_108 = 0;
  while( true ) {
    uVar1 = local_108;
    (*cases->_vptr_CaseFactories[2])(&local_120);
    sVar2 = std::
            vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
            ::size(&local_120);
    std::
    vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
    ::~vector(&local_120);
    if (sVar2 <= uVar1) break;
    (*cases->_vptr_CaseFactories[2])(&local_148);
    ppCVar3 = std::
              vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
              ::operator[](&local_148,local_108);
    node = &createFuncGroup((PrecisionTestContext *)&ndx,*ppCVar3)->super_TestNode;
    tcu::TestNode::addChild(&dstGroup->super_TestNode,node);
    std::
    vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
    ::~vector(&local_148);
    local_108 = local_108 + 1;
  }
  PrecisionTestContext::~PrecisionTestContext((PrecisionTestContext *)&ndx);
  return;
}

Assistant:

void addBuiltinPrecisionTests (TestContext&					testCtx,
							   RenderContext&				renderCtx,
							   const CaseFactories&			cases,
							   const vector<ShaderType>&	shaderTypes,
							   TestCaseGroup&				dstGroup)
{
	const int						userRandoms	= testCtx.getCommandLine().getTestIterationCount();
	const int						defRandoms	= 16384;
	const int						numRandoms	= userRandoms > 0 ? userRandoms : defRandoms;
	const FloatFormat				highp		(-126, 127, 23, true,
												 tcu::MAYBE,	// subnormals
												 tcu::YES,		// infinities
												 tcu::MAYBE);	// NaN
	// \todo [2014-04-01 lauri] Check these once Khronos bug 11840 is resolved.
	const FloatFormat				mediump		(-13, 13, 9, false);
	// A fixed-point format is just a floating point format with a fixed
	// exponent and support for subnormals.
	const FloatFormat				lowp		(0, 0, 7, false, tcu::YES);
	const PrecisionTestContext		ctx			(testCtx, renderCtx, highp, mediump, lowp,
												 shaderTypes, numRandoms);

	for (size_t ndx = 0; ndx < cases.getFactories().size(); ++ndx)
		dstGroup.addChild(createFuncGroup(ctx, *cases.getFactories()[ndx]));
}